

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O2

bool __thiscall
draco::KdTreeAttributesDecoder::
DecodePoints<6,draco::PointAttributeVectorOutputIterator<unsigned_int>>
          (KdTreeAttributesDecoder *this,int total_dimensionality,int num_expected_points,
          DecoderBuffer *in_buffer,PointAttributeVectorOutputIterator<unsigned_int> *out_iterator)

{
  bool bVar1;
  DynamicIntegerPointsKdTreeDecoder<6> decoder;
  DynamicIntegerPointsKdTreeDecoder<6> DStack_428;
  
  DynamicIntegerPointsKdTreeDecoder<6>::DynamicIntegerPointsKdTreeDecoder
            (&DStack_428,total_dimensionality);
  bVar1 = DynamicIntegerPointsKdTreeDecoder<6>::
          DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                    (&DStack_428,in_buffer,out_iterator,num_expected_points);
  DynamicIntegerPointsKdTreeDecoder<6>::~DynamicIntegerPointsKdTreeDecoder(&DStack_428);
  return bVar1 && DStack_428.num_decoded_points_ == num_expected_points;
}

Assistant:

bool KdTreeAttributesDecoder::DecodePoints(int total_dimensionality,
                                           int num_expected_points,
                                           DecoderBuffer *in_buffer,
                                           OutIteratorT *out_iterator) {
  DynamicIntegerPointsKdTreeDecoder<level_t> decoder(total_dimensionality);
  if (!decoder.DecodePoints(in_buffer, *out_iterator, num_expected_points) ||
      decoder.num_decoded_points() != num_expected_points) {
    return false;
  }
  return true;
}